

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O3

void (anonymous_namespace)::run_tests<false,6>(void)

{
  undefined8 uVar1;
  undefined1 auVar2 [8];
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  _Tuple_impl<2UL,_unsigned_int> _Var9;
  size_type_conflict sVar10;
  _Head_base<2UL,_unsigned_int,_false> _Var11;
  const_reference piVar12;
  void *pvVar13;
  int *piVar14;
  undefined8 *puVar15;
  void *pvVar16;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Var17;
  reference piVar18;
  void *pvVar19;
  reference piVar20;
  const_reference piVar21;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> *p_Var22;
  reference pcVar23;
  ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_> __dest;
  char *__function;
  uint32_t i;
  long lVar24;
  long lVar25;
  ulong uVar26;
  uint32_t index;
  value_type_conflict *__val_4;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Var27;
  int iVar28;
  value_type_conflict *__val_14;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Var29;
  uint32_t i_1;
  ulong uVar30;
  int *piVar31;
  value_type_conflict *__val;
  undefined8 *puVar32;
  uint32_t i_8;
  uint index_00;
  vector<int,_false,_6> vec3;
  vector<int,_false,_6> v3;
  vector<int,_false,_6> old_vec;
  vector<int,_false,_6> vec4;
  vector<int,_false,_6> vec1;
  vector<int,_false,_6> vec_11;
  vector<int,_false,_6> vec2;
  vector<char,_false,_6> new_buf;
  vector<int,_false,_6> slice;
  persistent_type cat_pushed;
  transient_type buf2_tr;
  vector<int,_false,_6> v;
  iterator __end2;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_2e0;
  undefined1 local_2d8 [16];
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_2c8;
  _Head_base<0UL,_const_int_*,_false> local_2c0;
  undefined1 local_2b8 [8];
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_2b0;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_2a8;
  _Head_base<0UL,_const_int_*,_false> local_2a0;
  undefined8 *local_290;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_288;
  undefined1 local_280 [16];
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_270;
  _Head_base<0UL,_const_int_*,_false> local_268;
  void *local_260;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_258;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_250;
  uint local_248;
  undefined8 local_240;
  undefined8 local_238;
  void *local_230;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_228;
  char local_219;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_218;
  void *local_210;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_208;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_200;
  undefined1 local_1f8 [16];
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> _Stack_1e8;
  _Head_base<0UL,_const_int_*,_false> local_1e0;
  ios_base local_178 [264];
  long local_70;
  undefined8 *local_68;
  long local_60;
  long local_58;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_50;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_48;
  _Tuple_impl<1UL,_unsigned_int,_unsigned_int> local_40;
  ref<immutable::transient_rrb<int,_false,_6>_> local_38;
  
  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_1f8);
  if (((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
       (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) &&
     (TestEq<bool,bool>(true,*(uint *)local_1f8._0_8_ == 0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0xf,
                        "void (anonymous namespace)::test_empty_vector() [atomic_ref_counting = false, N = 6]"
                       ),
     (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
     (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)) {
    TestEq<int,unsigned_int>
              (0,*(uint *)local_1f8._0_8_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
               ,0x10,
               "void (anonymous namespace)::test_empty_vector() [atomic_ref_counting = false, N = 6]"
              );
    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_1f8);
    immutable::vector<int,_false,_6>::push_back
              ((vector<int,_false,_6> *)local_2d8,
               (value_type_conflict)(vector<int,_false,_6> *)local_1f8);
    immutable::vector<int,_false,_6>::push_back
              ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
    if (((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) &&
       (((TestEq<bool,bool>(true,*(uint *)local_1f8._0_8_ == 0,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x19,
                            "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                           ),
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0 &&
         (TestEq<int,unsigned_int>
                    (0,*(uint *)local_1f8._0_8_,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                     ,0x1a,
                     "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                    ),
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
         (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)) &&
        (TestEq<int,unsigned_int>
                   (1,*(uint *)local_2d8._0_8_,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                    ,0x1b,
                    "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                   ),
        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)))) {
      TestEq<int,unsigned_int>
                (2,*(uint *)local_2b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                 ,0x1c,
                 "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                );
      piVar12 = immutable::vector<int,_false,_6>::operator[]((vector<int,_false,_6> *)local_2d8,0);
      TestEq<int,int>(3,*piVar12,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x1d,
                      "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                     );
      piVar12 = immutable::vector<int,_false,_6>::operator[]((vector<int,_false,_6> *)local_2b8,0);
      TestEq<int,int>(3,*piVar12,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x1e,
                      "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                     );
      piVar12 = immutable::vector<int,_false,_6>::operator[]((vector<int,_false,_6> *)local_2b8,1);
      TestEq<int,int>(7,*piVar12,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                      ,0x1f,
                      "void (anonymous namespace)::test_push_back_simple() [atomic_ref_counting = false, N = 6]"
                     );
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
      pvVar13 = operator_new(160000);
      lVar24 = 0;
      memset(pvVar13,0,160000);
      do {
        iVar7 = rand();
        *(int *)((long)pvVar13 + lVar24) = iVar7;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 160000);
      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
      lVar24 = 0;
      do {
        immutable::vector<int,_false,_6>::push_back
                  ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_2b8;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        lVar24 = lVar24 + 4;
      } while (lVar24 != 160000);
      lVar24 = 0;
      do {
        iVar7 = *(int *)((long)pvVar13 + lVar24 * 4);
        piVar12 = immutable::vector<int,_false,_6>::operator[]
                            ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)lVar24);
        TestEq<int,int>(iVar7,*piVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x30,
                        "void (anonymous namespace)::test_push_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                       );
        lVar24 = lVar24 + 1;
      } while (lVar24 != 40000);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
      operator_delete(pvVar13,160000);
      piVar14 = (int *)operator_new(160000);
      lVar24 = 0;
      memset(piVar14,0,160000);
      do {
        iVar7 = rand();
        *(int *)((long)piVar14 + lVar24) = iVar7;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 160000);
      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
      lVar24 = 0;
      do {
        immutable::vector<int,_false,_6>::push_back
                  ((vector<int,_false,_6> *)local_2b8,
                   (value_type_conflict)(vector<int,_false,_6> *)local_2d8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_2b8;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        piVar12 = immutable::vector<int,_false,_6>::front((vector<int,_false,_6> *)local_2d8);
        TestEq<int,int>(*piVar14,*piVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x3f,
                        "void (anonymous namespace)::test_front(uint32_t) [atomic_ref_counting = false, N = 6]"
                       );
        lVar24 = lVar24 + 4;
      } while (lVar24 != 160000);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
      operator_delete(piVar14,160000);
      pvVar13 = operator_new(160000);
      lVar24 = 0;
      memset(pvVar13,0,160000);
      do {
        iVar7 = rand();
        *(int *)((long)pvVar13 + lVar24) = iVar7;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 160000);
      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
      lVar24 = 0;
      do {
        immutable::vector<int,_false,_6>::push_back
                  ((vector<int,_false,_6> *)local_2b8,
                   (value_type_conflict)(vector<int,_false,_6> *)local_2d8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_2b8;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        piVar12 = immutable::vector<int,_false,_6>::back((vector<int,_false,_6> *)local_2d8);
        TestEq<int,int>(*(int *)((long)pvVar13 + lVar24),*piVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x4f,
                        "void (anonymous namespace)::test_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                       );
        lVar24 = lVar24 + 4;
      } while (lVar24 != 160000);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
      operator_delete(pvVar13,160000);
      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
      for (uVar8 = 1; uVar8 != 0x9c41; uVar8 = uVar8 + 1) {
        immutable::vector<int,_false,_6>::push_back
                  ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_2b8;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ ==
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012b7f6;
        TestEq<unsigned_int,unsigned_int>
                  (uVar8,*(uint *)local_2d8._0_8_,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                   ,0x5a,
                   "void (anonymous namespace)::test_size(uint32_t) [atomic_ref_counting = false, N = 6]"
                  );
      }
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
      pvVar13 = operator_new(160000);
      lVar24 = 0;
      memset(pvVar13,0,160000);
      do {
        iVar7 = rand();
        *(int *)((long)pvVar13 + lVar24) = iVar7;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 160000);
      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
      lVar24 = 0;
      do {
        immutable::vector<int,_false,_6>::push_back
                  ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_2b8;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        if (lVar24 != 0) {
          immutable::vector<int,_false,_6>::pop_back((vector<int,_false,_6> *)local_1f8);
          piVar12 = immutable::vector<int,_false,_6>::back((vector<int,_false,_6> *)local_1f8);
          TestEq<int,int>(*piVar12,*(int *)((long)pvVar13 + lVar24 * 4 + -4),
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                          ,0x6e,
                          "void (anonymous namespace)::test_pop_back(uint32_t) [atomic_ref_counting = false, N = 6]"
                         );
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 40000);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
      operator_delete(pvVar13,160000);
      pvVar13 = operator_new(1600000);
      lVar24 = 0;
      memset(pvVar13,0,1600000);
      do {
        iVar7 = rand();
        *(int *)((long)pvVar13 + lVar24) = iVar7;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 1600000);
      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
      lVar24 = 0;
      do {
        immutable::vector<int,_false,_6>::push_back
                  ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_2b8;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 400000);
      puVar15 = (undefined8 *)operator_new(0x82364);
      memset(puVar15,0,0x82364);
      pvVar16 = operator_new(0x82364);
      lVar24 = 0;
      memset(pvVar16,0,0x82364);
      do {
        iVar7 = rand();
        *(int *)((long)puVar15 + lVar24 * 4) = iVar7;
        uVar8 = rand();
        *(uint *)((long)pvVar16 + lVar24 * 4) = uVar8 % 400000;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x208d9);
      lVar24 = 0;
      local_290 = puVar15;
      local_260 = pvVar16;
      do {
        uVar8 = *(uint *)((long)local_260 + lVar24 * 4);
        local_2b8 = (undefined1  [8])local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        immutable::vector<int,_false,_6>::set
                  ((vector<int,_false,_6> *)local_280,(size_type_conflict)local_2d8,uVar8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_280._0_8_;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
        piVar12 = immutable::vector<int,_false,_6>::operator[]
                            ((vector<int,_false,_6> *)local_2b8,uVar8);
        iVar7 = *piVar12;
        piVar12 = immutable::vector<int,_false,_6>::operator[]
                            ((vector<int,_false,_6> *)local_2d8,uVar8);
        iVar28 = *piVar12;
        TestEq<int,int>(iVar7,*(int *)((long)pvVar13 + (ulong)uVar8 * 4),
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x8f,
                        "void (anonymous namespace)::test_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                       );
        TestEq<int,int>(iVar28,*(int *)((long)local_290 + lVar24 * 4),
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                        ,0x90,
                        "void (anonymous namespace)::test_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                       );
        *(int *)((long)pvVar13 + (ulong)uVar8 * 4) = iVar28;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        puVar15 = local_290;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x208d9);
      operator_delete(local_260,0x82364);
      operator_delete(puVar15,0x82364);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
      operator_delete(pvVar13,1600000);
      pvVar13 = operator_new(40000);
      lVar24 = 0;
      memset(pvVar13,0,40000);
      do {
        iVar7 = rand();
        *(int *)((long)pvVar13 + lVar24) = iVar7;
        lVar24 = lVar24 + 4;
      } while (lVar24 != 40000);
      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
      lVar24 = 0;
      do {
        immutable::vector<int,_false,_6>::push_back
                  ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
        local_1f8._0_8_ = local_2d8._0_8_;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2d8._0_8_ = local_2b8;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
        lVar24 = lVar24 + 1;
      } while (lVar24 != 10000);
      memmove((void *)((long)pvVar13 + 20000),(void *)((long)pvVar13 + 0x4e24),0x4e1c);
      immutable::vector<int,_false,_6>::erase
                ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)local_2d8);
      local_1f8._0_8_ = local_2d8._0_8_;
      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>)._M_i
             = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
               super___atomic_base<unsigned_int>)._M_i + 1;
      }
      local_2d8._0_8_ = local_2b8;
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
        TestEq<unsigned_int,unsigned_long>
                  (*(uint *)local_2d8._0_8_,9999,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                   ,200,
                   "void (anonymous namespace)::test_erase_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                  );
        lVar24 = 0;
        do {
          iVar7 = *(int *)((long)pvVar13 + lVar24 * 4);
          piVar12 = immutable::vector<int,_false,_6>::operator[]
                              ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)lVar24);
          TestEq<int,int>(iVar7,*piVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                          ,0xcb,
                          "void (anonymous namespace)::test_erase_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                         );
          lVar24 = lVar24 + 1;
        } while (lVar24 != 9999);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
        operator_delete(pvVar13,40000);
        test_erase<false,6>(200,0x32);
        _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)operator_new(40000);
        lVar24 = 0;
        local_1f8._0_8_ = _Var17;
        _Stack_1e8 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var17 + 40000);
        memset((void *)_Var17,0,40000);
        local_1f8._8_8_ = (long)_Var17 + 40000;
        do {
          iVar7 = rand();
          *(int *)((long)_Var17 + lVar24) = iVar7;
          lVar24 = lVar24 + 4;
        } while (lVar24 != 40000);
        immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
        lVar24 = 0;
        do {
          immutable::vector<int,_false,_6>::push_back
                    ((vector<int,_false,_6> *)local_280,(value_type_conflict)local_2b8);
          local_2d8._0_8_ = local_2b8;
          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->super___atomic_base<unsigned_int>).
            _M_i = (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                   super___atomic_base<unsigned_int>)._M_i + 1;
          }
          local_2b8 = (undefined1  [8])local_280._0_8_;
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 10000);
        local_2d8._0_4_ = 0x29a;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  ((vector<int,_std::allocator<int>_> *)local_1f8,(int *)((long)_Var17 + 20000),
                   (value_type_conflict *)local_2d8);
        immutable::vector<int,_false,_6>::insert
                  ((vector<int,_false,_6> *)local_280,(size_type_conflict)local_2b8,5000);
        local_2d8._0_8_ = local_2b8;
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->super___atomic_base<unsigned_int>).
          _M_i = (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                 super___atomic_base<unsigned_int>)._M_i + 1;
        }
        local_2b8 = (undefined1  [8])local_280._0_8_;
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                  ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
          TestEq<unsigned_int,unsigned_long>
                    (*(uint *)local_2b8,(long)(local_1f8._8_8_ - local_1f8._0_8_) >> 2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                     ,0x106,
                     "void (anonymous namespace)::test_insert_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                    );
          lVar24 = 0;
          do {
            uVar8 = *(uint *)(local_1f8._0_8_ + lVar24 * 4);
            piVar12 = immutable::vector<int,_false,_6>::operator[]
                                ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)lVar24);
            TestEq<int,int>(uVar8,*piVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x109,
                            "void (anonymous namespace)::test_insert_single(uint32_t) [atomic_ref_counting = false, N = 6]"
                           );
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x2711);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
            operator_delete((void *)local_1f8._0_8_,(long)_Stack_1e8 - local_1f8._0_8_);
          }
          test_concat<false,6>(200);
          pvVar13 = operator_new(40000);
          lVar24 = 0;
          memset(pvVar13,0,40000);
          do {
            iVar7 = rand();
            *(int *)((long)pvVar13 + lVar24) = iVar7;
            lVar24 = lVar24 + 4;
          } while (lVar24 != 40000);
          immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
          lVar24 = 0;
          do {
            immutable::vector<int,_false,_6>::push_back
                      ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
            local_1f8._0_8_ = local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 10000);
          immutable::vector<int,_false,_6>::drop
                    ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)local_2d8);
          local_1f8._0_8_ = local_2d8._0_8_;
          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
            (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>).
            _M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                   super___atomic_base<unsigned_int>)._M_i + 1;
          }
          local_2d8._0_8_ = local_2b8;
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
          lVar24 = 0;
          do {
            iVar7 = *(int *)((long)pvVar13 + lVar24 * 4 + 0xc);
            piVar12 = immutable::vector<int,_false,_6>::operator[]
                                ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)lVar24);
            TestEq<int,int>(iVar7,*piVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                            ,0x139,
                            "void (anonymous namespace)::test_drop(uint32_t) [atomic_ref_counting = false, N = 6]"
                           );
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x270d);
          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
            TestEq<unsigned_int,unsigned_int>
                      (0x270d,*(uint *)local_2d8._0_8_,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                       ,0x13b,
                       "void (anonymous namespace)::test_drop(uint32_t) [atomic_ref_counting = false, N = 6]"
                      );
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
            operator_delete(pvVar13,40000);
            pvVar13 = operator_new(40000);
            lVar24 = 0;
            memset(pvVar13,0,40000);
            do {
              iVar7 = rand();
              *(int *)((long)pvVar13 + lVar24) = iVar7;
              lVar24 = lVar24 + 4;
            } while (lVar24 != 40000);
            immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
            lVar24 = 0;
            do {
              immutable::vector<int,_false,_6>::push_back
                        ((vector<int,_false,_6> *)local_2b8,(value_type_conflict)local_2d8);
              local_1f8._0_8_ = local_2d8._0_8_;
              if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                  (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                super___atomic_base<unsigned_int>)._M_i =
                     (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                     super___atomic_base<unsigned_int>)._M_i + 1;
              }
              local_2d8._0_8_ = local_2b8;
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
              lVar24 = lVar24 + 1;
            } while (lVar24 != 10000);
            immutable::vector<int,_false,_6>::take
                      ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)local_2d8);
            local_1f8._0_8_ = local_2d8._0_8_;
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->super___atomic_base<unsigned_int>
              )._M_i = (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
            }
            local_2d8._0_8_ = local_2b8;
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                      ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
            lVar24 = 0;
            do {
              iVar7 = *(int *)((long)pvVar13 + lVar24 * 4);
              piVar12 = immutable::vector<int,_false,_6>::operator[]
                                  ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)lVar24);
              TestEq<int,int>(iVar7,*piVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                              ,0x14e,
                              "void (anonymous namespace)::test_take(uint32_t) [atomic_ref_counting = false, N = 6]"
                             );
              lVar24 = lVar24 + 1;
            } while (lVar24 != 3);
            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
              TestEq<int,unsigned_int>
                        (3,*(uint *)local_2d8._0_8_,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                         ,0x150,
                         "void (anonymous namespace)::test_take(uint32_t) [atomic_ref_counting = false, N = 6]"
                        );
              immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                        ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
              operator_delete(pvVar13,40000);
              piVar14 = (int *)operator_new(40000);
              lVar24 = 0;
              memset(piVar14,0,40000);
              do {
                iVar7 = rand();
                *(int *)((long)piVar14 + lVar24) = iVar7;
                lVar24 = lVar24 + 4;
              } while (lVar24 != 40000);
              immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
              lVar24 = 0;
              do {
                immutable::vector<int,_false,_6>::push_back
                          ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8);
                local_1f8._0_8_ = local_2b8;
                if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                    (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                  (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                  super___atomic_base<unsigned_int>)._M_i =
                       (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 1;
                }
                local_2b8 = (undefined1  [8])local_2d8._0_8_;
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                lVar24 = lVar24 + 1;
              } while (lVar24 != 10000);
              local_1f8._0_8_ = local_2b8;
              if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                  (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffff00000000;
                _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                     (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                local_1e0._M_head_impl = (int *)0x0;
                local_2d8._0_8_ = local_2b8;
                (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                super___atomic_base<unsigned_int>)._M_i =
                     (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                     super___atomic_base<unsigned_int>)._M_i + 2;
                local_2d8._8_4_ = (uint)*(_Head_base<2UL,_unsigned_int,_false> *)local_2b8;
                _Stack_2c8.super__Tuple_impl<2UL,_unsigned_int>.
                super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                     (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                _Stack_2c8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                local_2c0._M_head_impl = (int *)0x0;
                if ((uint)*(_Head_base<2UL,_unsigned_int,_false> *)local_2b8 != 0) {
                  piVar31 = piVar14;
                  do {
                    do {
                      piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                          ((vector_iterator<int,_false,_6> *)local_1f8);
                      TestEq<int,int>(*piVar18,*piVar31,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x168,
                                      "void (anonymous namespace)::test_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                     );
                      _Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)(local_1f8._8_4_ + 1);
                      local_1f8._8_4_ =
                           _Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      piVar31 = piVar31 + 1;
                    } while (_Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl !=
                             (_Head_base<2UL,_unsigned_int,_false>)local_2d8._8_4_);
                  } while (local_1f8._0_8_ != local_2d8._0_8_);
                }
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                operator_delete(piVar14,40000);
                pvVar13 = operator_new(4000);
                memset(pvVar13,0,4000);
                pvVar16 = operator_new(4000);
                memset(pvVar16,0,4000);
                puVar15 = (undefined8 *)operator_new(4000);
                memset(puVar15,0,4000);
                pvVar19 = operator_new(4000);
                local_58 = (long)pvVar13 + 4000;
                local_60 = (long)pvVar16 + 4000;
                lVar24 = 0;
                memset(pvVar19,0,4000);
                do {
                  iVar7 = rand();
                  *(int *)((long)pvVar13 + lVar24) = iVar7;
                  lVar24 = lVar24 + 4;
                } while (lVar24 != 4000);
                lVar24 = 0;
                do {
                  iVar7 = rand();
                  *(int *)((long)pvVar16 + lVar24) = iVar7;
                  lVar24 = lVar24 + 4;
                } while (lVar24 != 4000);
                lVar24 = 0;
                do {
                  iVar7 = rand();
                  *(int *)((long)puVar15 + lVar24) = iVar7;
                  lVar24 = lVar24 + 4;
                } while (lVar24 != 4000);
                lVar24 = 0;
                do {
                  iVar7 = rand();
                  *(int *)((long)pvVar19 + lVar24) = iVar7;
                  lVar24 = lVar24 + 4;
                } while (lVar24 != 4000);
                immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_280);
                immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                local_210 = pvVar16;
                immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_2e0);
                local_290 = puVar15;
                local_230 = pvVar13;
                local_68 = puVar15 + 500;
                immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_288);
                local_70 = (long)pvVar19 + 4000;
                lVar24 = 0;
                local_260 = pvVar19;
                do {
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_280);
                  local_1f8._0_8_ = local_280._0_8_;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_280._0_8_ = local_2d8._0_8_;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_250);
                  _Var17 = local_250;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_250.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)
                       (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                  local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                       local_2d8._4_4_;
                  _Var27 = local_250;
                  local_250.super__Tuple_impl<2UL,_unsigned_int> =
                       _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_250.super__Head_base<1UL,_unsigned_int,_false> =
                       _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._0_4_ =
                       local_250.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._4_4_ =
                       local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_250 = _Var27;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_2e0);
                  _Var17 = local_2e0;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)
                       (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                  local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                       local_2d8._4_4_;
                  _Var27 = local_2e0;
                  local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                       _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                       _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._0_4_ =
                       local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._4_4_ =
                       local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_2e0 = _Var27;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  immutable::vector<int,_false,_6>::push_back
                            ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_288);
                  _Var17 = local_288;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_288.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)
                       (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                  local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                       local_2d8._4_4_;
                  _Var27 = local_288;
                  local_288.super__Tuple_impl<2UL,_unsigned_int> =
                       _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_288.super__Head_base<1UL,_unsigned_int,_false> =
                       _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._0_4_ =
                       local_288.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_1f8._4_4_ =
                       local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  local_288 = _Var27;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  pvVar13 = local_230;
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 1000);
                local_2b8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x0;
                local_2b8._4_4_ = 0;
                _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                     (_Head_base<2UL,_unsigned_int,_false>)0x0;
                _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                local_2a8.super__Tuple_impl<2UL,_unsigned_int>.
                super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                     (_Head_base<2UL,_unsigned_int,_false>)0x0;
                local_2a8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)local_2b8,0,local_230,local_58);
                pvVar16 = local_210;
                std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_210,
                           local_60);
                std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_290,
                           local_68);
                std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_260,
                           local_70);
                immutable::operator+
                          ((immutable *)local_2d8,(vector<int,_false,_6> *)local_280,
                           (vector<int,_false,_6> *)&local_250);
                immutable::operator+
                          ((immutable *)local_1f8,(vector<int,_false,_6> *)local_2d8,
                           (vector<int,_false,_6> *)&local_2e0);
                immutable::operator+
                          ((immutable *)&local_258,(vector<int,_false,_6> *)local_1f8,
                           (vector<int,_false,_6> *)&local_288);
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                          ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                local_1f8._0_4_ =
                     local_258.super__Tuple_impl<2UL,_unsigned_int>.
                     super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                local_1f8._4_4_ = local_258.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                if (local_258 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                  local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffff00000000;
                  _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                  _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                  local_1e0._M_head_impl = (int *)0x0;
                  local_2d8._0_4_ =
                       local_258.super__Tuple_impl<2UL,_unsigned_int>.
                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                  local_2d8._4_4_ =
                       local_258.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  (((atomic<unsigned_int> *)((long)local_258 + 0x20))->
                  super___atomic_base<unsigned_int>)._M_i =
                       (((atomic<unsigned_int> *)((long)local_258 + 0x20))->
                       super___atomic_base<unsigned_int>)._M_i + 2;
                  local_2d8._8_4_ = (uint)*(_Head_base<2UL,_unsigned_int,_false> *)local_258;
                  _Stack_2c8.super__Tuple_impl<2UL,_unsigned_int>.
                  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                  _Stack_2c8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                  local_2c0._M_head_impl = (int *)0x0;
                  if ((uint)*(_Head_base<2UL,_unsigned_int,_false> *)local_258 != 0) {
                    _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8;
                    do {
                      do {
                        piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                            ((vector_iterator<int,_false,_6> *)local_1f8);
                        TestEq<int,int>(*piVar18,*(uint *)_Var17,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x192,
                                        "void (anonymous namespace)::test_iterator_2(uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        _Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)(local_1f8._8_4_ + 1);
                        local_1f8._8_4_ =
                             _Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)((long)_Var17 + 4);
                      } while (_Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl !=
                               (_Head_base<2UL,_unsigned_int,_false>)local_2d8._8_4_);
                    } while (local_1f8._0_8_ != local_2d8._0_8_);
                  }
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_258);
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
                  }
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                  operator_delete(local_260,4000);
                  operator_delete(local_290,4000);
                  operator_delete(pvVar16,4000);
                  operator_delete(pvVar13,4000);
                  piVar14 = (int *)operator_new(40000);
                  lVar24 = 0;
                  memset(piVar14,0,40000);
                  do {
                    iVar7 = rand();
                    *(int *)((long)piVar14 + lVar24) = iVar7;
                    lVar24 = lVar24 + 4;
                  } while (lVar24 != 40000);
                  immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                  lVar24 = 0;
                  do {
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8);
                    local_1f8._0_8_ = local_2b8;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_2b8 = (undefined1  [8])local_2d8._0_8_;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 10000);
                  memmove(piVar14 + 0x9c4,piVar14 + 5000,20000);
                  immutable::vector<int,_false,_6>::erase
                            ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)local_2b8,0x9c4)
                  ;
                  local_1f8._0_8_ = local_2b8;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 1;
                  }
                  local_2b8 = (undefined1  [8])local_2d8._0_8_;
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                  immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                            ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                  local_1f8._0_8_ = local_2b8;
                  if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                      (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                    local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffff00000000;
                    _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                    _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                    local_1e0._M_head_impl = (int *)0x0;
                    local_2d8._0_8_ = local_2b8;
                    (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                    super___atomic_base<unsigned_int>)._M_i =
                         (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                         super___atomic_base<unsigned_int>)._M_i + 2;
                    local_2d8._8_4_ = *(uint *)local_2b8;
                    _Stack_2c8.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                    _Stack_2c8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0xffffffff;
                    local_2c0._M_head_impl = (int *)0x0;
                    if (*(uint *)local_2b8 != 0) {
                      piVar31 = piVar14;
                      do {
                        do {
                          piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                              ((vector_iterator<int,_false,_6> *)local_1f8);
                          TestEq<int,int>(*piVar18,*piVar31,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x1ae,
                                          "void (anonymous namespace)::test_iterator_3(uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          sVar10 = local_1f8._8_4_ + 1;
                          local_1f8._8_4_ = sVar10;
                          piVar31 = piVar31 + 1;
                        } while (sVar10 != local_2d8._8_4_);
                      } while (local_1f8._0_8_ != local_2d8._0_8_);
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    operator_delete(piVar14,40000);
                    pvVar13 = operator_new(40000);
                    lVar24 = 0;
                    memset(pvVar13,0,40000);
                    do {
                      iVar7 = rand();
                      *(int *)((long)pvVar13 + lVar24) = iVar7;
                      lVar24 = lVar24 + 4;
                    } while (lVar24 != 40000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                    lVar24 = 0;
                    do {
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)&local_250)
                      ;
                      _Var17 = local_250;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_250.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                      local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           local_2d8._4_4_;
                      _Var27 = local_250;
                      local_250.super__Tuple_impl<2UL,_unsigned_int> =
                           _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_250.super__Head_base<1UL,_unsigned_int,_false> =
                           _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._0_4_ =
                           local_250.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_250 = _Var27;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 10000);
                    immutable::vector<int,_false,_6>::rbegin
                              ((reverse_iterator *)local_2b8,(vector<int,_false,_6> *)&local_250);
                    immutable::vector<int,_false,_6>::rend
                              ((reverse_iterator *)local_280,(vector<int,_false,_6> *)&local_250);
                    piVar14 = (int *)((long)pvVar13 + 0x9c3c);
                    while( true ) {
                      uVar3 = local_280._8_4_;
                      uVar1 = local_280._0_8_;
                      auVar2 = local_2b8;
                      local_1f8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_1e0._M_head_impl = local_2a0._M_head_impl;
                      local_1f8._8_4_ =
                           _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._12_4_ =
                           _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      uVar4 = local_1f8._8_8_;
                      _Stack_1e8 = local_2a8;
                      local_2d8._0_8_ = local_280._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2c0._M_head_impl = local_268._M_head_impl;
                      local_2d8._12_4_ = local_280._12_4_;
                      local_2d8._8_4_ = local_280._8_4_;
                      _Stack_2c8 = _Stack_270;
                      local_1f8._8_4_ =
                           _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      uVar5 = local_1f8._8_4_;
                      local_1f8._8_8_ = uVar4;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      if ((auVar2 == (undefined1  [8])uVar1) && (uVar5 == uVar3)) break;
                      piVar20 = std::reverse_iterator<immutable::vector_iterator<int,_false,_6>_>::
                                operator*((reverse_iterator<immutable::vector_iterator<int,_false,_6>_>
                                           *)local_2b8);
                      TestEq<int,int>(*piVar20,*piVar14,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x1c7,
                                      "void (anonymous namespace)::test_reverse_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                     );
                      _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)
                           (_Head_base<2UL,_unsigned_int,_false>)
                           ((int)_Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + -1);
                      piVar14 = piVar14 + -1;
                    }
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    operator_delete(pvVar13,40000);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                    local_2b8 = (undefined1  [8])local_2d8._0_8_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    bVar6 = immutable::vector<int,_false,_6>::operator==
                                      ((vector<int,_false,_6> *)local_2d8,
                                       (vector<int,_false,_6> *)local_2b8);
                    TestEq<bool,bool>(true,bVar6,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x1d0,
                                      "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                     );
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)local_280,(value_type_conflict)local_2d8);
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)&local_250,(value_type_conflict)local_2d8);
                    bVar6 = immutable::vector<int,_false,_6>::operator==
                                      ((vector<int,_false,_6> *)local_280,
                                       (vector<int,_false,_6> *)&local_250);
                    TestEq<bool,bool>(true,bVar6,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x1d3,
                                      "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                     );
                    local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                    local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_280._4_4_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    bVar6 = immutable::vector<int,_false,_6>::operator==
                                      ((vector<int,_false,_6> *)&local_2e0,
                                       (vector<int,_false,_6> *)local_280);
                    TestEq<bool,bool>(true,bVar6,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x1d5,
                                      "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                     );
                    bVar6 = immutable::vector<int,_false,_6>::operator==
                                      ((vector<int,_false,_6> *)&local_2e0,
                                       (vector<int,_false,_6> *)&local_250);
                    TestEq<bool,bool>(true,bVar6,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x1d6,
                                      "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                     );
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_288);
                    bVar6 = immutable::vector<int,_false,_6>::operator==
                                      ((vector<int,_false,_6> *)local_2d8,
                                       (vector<int,_false,_6> *)&local_288);
                    TestEq<bool,bool>(true,bVar6,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x1d8,
                                      "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                     );
                    immutable::vector<int,_false,_6>::push_back
                              ((vector<int,_false,_6> *)&local_258,(value_type_conflict)local_2d8);
                    _Var17 = local_288;
                    if (local_258 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)((long)local_258 + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)((long)local_258 + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    local_288 = local_258;
                    _Var27 = local_288;
                    local_288.super__Tuple_impl<2UL,_unsigned_int> =
                         _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_288.super__Head_base<1UL,_unsigned_int,_false> =
                         _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._0_4_ =
                         local_288.super__Tuple_impl<2UL,_unsigned_int>.
                         super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                    local_1f8._4_4_ =
                         local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                    local_288 = _Var27;
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_258);
                    bVar6 = immutable::vector<int,_false,_6>::operator==
                                      ((vector<int,_false,_6> *)local_2d8,
                                       (vector<int,_false,_6> *)&local_288);
                    TestEq<bool,bool>(true,!bVar6,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x1da,
                                      "void (anonymous namespace)::test_vector_equality() [atomic_ref_counting = false, N = 6]"
                                     );
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                    _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)operator_new(0x28);
                    local_1f8._8_8_ = (long)_Var17 + 0x28;
                    *(undefined8 *)_Var17 = 0;
                    *(undefined8 *)((long)_Var17 + 8) = 0;
                    ((ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_6>,_true>_>
                      *)((long)_Var17 + 0x10))->ptr =
                         (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0;
                    ((ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_6>,_true>_>
                      *)((long)_Var17 + 0x18))->ptr =
                         (tree_node<immutable::vector<char,_false,_6>,_true> *)0x0;
                    *(undefined8 *)((long)_Var17 + 0x20) = 0;
                    lVar24 = 0;
                    local_1f8._0_8_ = _Var17;
                    _Stack_1e8 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._8_8_;
                    do {
                      iVar7 = rand();
                      *(int *)((long)_Var17 + lVar24) = iVar7;
                      lVar24 = lVar24 + 4;
                    } while (lVar24 != 0x28);
                    puVar15 = (undefined8 *)operator_new(0x28);
                    puVar15[2] = 0;
                    puVar15[3] = 0;
                    *puVar15 = 0;
                    puVar15[1] = 0;
                    puVar15[4] = 0;
                    lVar24 = 0;
                    do {
                      iVar7 = rand();
                      *(int *)((long)puVar15 + lVar24) = iVar7;
                      lVar24 = lVar24 + 4;
                    } while (lVar24 != 0x28);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                    local_290 = puVar15 + 5;
                    lVar24 = 0;
                    do {
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)local_280,(value_type_conflict)local_2b8);
                      local_2d8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_280._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 10);
                    immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_280);
                    lVar24 = 0;
                    do {
                      immutable::vector<int,_false,_6>::push_back
                                ((vector<int,_false,_6> *)&local_250,(value_type_conflict)local_280)
                      ;
                      local_2d8._0_8_ = local_280._0_8_;
                      if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_280._0_4_ =
                           local_250.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_280._4_4_ =
                           local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != 10);
                    std::vector<int,std::allocator<int>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((vector<int,std::allocator<int>> *)local_1f8,
                               (uint *)((long)_Var17 + 0x14),puVar15,local_290);
                    local_250.super__Tuple_impl<2UL,_unsigned_int>.
                    super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_int,_false>)
                         (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                    local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         local_280._4_4_;
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                      super___atomic_base<unsigned_int>)._M_i =
                           (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                           super___atomic_base<unsigned_int>)._M_i + 1;
                    }
                    immutable::vector<int,_false,_6>::insert
                              ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)local_2b8,
                               (vector<int,_false,_6> *)0x5);
                    immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                              ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                    if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                        (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                      TestEq<unsigned_int,unsigned_long>
                                (*(uint *)local_2d8._0_8_,
                                 (long)(local_1f8._8_8_ - local_1f8._0_8_) >> 2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                 ,0x1f7,
                                 "void (anonymous namespace)::test_insert_vector(uint32_t) [atomic_ref_counting = false, N = 6]"
                                );
                      if (local_1f8._8_8_ != local_1f8._0_8_) {
                        uVar30 = 0;
                        do {
                          piVar12 = immutable::vector<int,_false,_6>::operator[]
                                              ((vector<int,_false,_6> *)local_2d8,
                                               (size_type_conflict)uVar30);
                          TestEq<int,int>(*piVar12,*(uint *)(local_1f8._0_8_ + uVar30 * 4),
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x1fa,
                                          "void (anonymous namespace)::test_insert_vector(uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          uVar30 = (ulong)((size_type_conflict)uVar30 + 1);
                        } while (uVar30 < (ulong)((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 2));
                      }
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      operator_delete(puVar15,0x28);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        operator_delete((void *)local_1f8._0_8_,(long)_Stack_1e8 - local_1f8._0_8_);
                      }
                      pvVar13 = operator_new(52000);
                      lVar24 = 0;
                      memset(pvVar13,0,52000);
                      do {
                        iVar7 = rand();
                        *(int *)((long)pvVar13 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 52000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_2b8,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar25 = 1;
                      lVar24 = 0;
                      do {
                        local_290 = (undefined8 *)lVar24;
                        immutable::transient_rrb_push<int,false,6>
                                  ((immutable *)local_1f8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,
                                   *(int *)((long)pvVar13 + lVar24 * 4));
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                        lVar24 = 0;
                        do {
                          piVar14 = immutable::transient_rrb_nth<int,false,6>
                                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                               local_2b8,(uint32_t)lVar24);
                          TestEq<int,int>(*(int *)((long)pvVar13 + lVar24 * 4),*piVar14,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x20f,
                                          "void (anonymous namespace)::test_transient_vector_push(uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          lVar24 = lVar24 + 1;
                        } while (lVar25 != lVar24);
                        lVar24 = (long)local_290 + 1;
                        lVar25 = lVar25 + 1;
                      } while (lVar24 != 13000);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      operator_delete(pvVar13,52000);
                      pvVar13 = operator_new(1600000);
                      lVar24 = 0;
                      memset(pvVar13,0,1600000);
                      do {
                        iVar7 = rand();
                        *(int *)((long)pvVar13 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 1600000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_2b8,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar24 = 0;
                      do {
                        immutable::transient_rrb_push<int,false,6>
                                  ((immutable *)local_1f8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,
                                   *(int *)((long)pvVar13 + lVar24 * 4));
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 400000);
                      immutable::vector<int,_false,_6>::vector
                                ((vector<int,_false,_6> *)local_280,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      local_1f8._0_8_ = local_2d8._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2d8._0_8_ = local_280._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_280,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      local_1f8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_280._0_8_;
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_280);
                      lVar24 = 399999;
                      do {
                        piVar21 = immutable::transient_vector<int,_false,_6>::back
                                            ((transient_vector<int,_false,_6> *)local_2b8);
                        TestEq<int,int>(*(int *)((long)pvVar13 + lVar24 * 4),*piVar21,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x228,
                                        "void (anonymous namespace)::test_transient_vector_pop(uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        immutable::transient_rrb_pop<int,false,6>
                                  ((immutable *)local_1f8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                        bVar6 = lVar24 != 0;
                        lVar24 = lVar24 + -1;
                      } while (bVar6);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      operator_delete(pvVar13,1600000);
                      puVar15 = (undefined8 *)operator_new(1600000);
                      lVar24 = 0;
                      memset(puVar15,0,1600000);
                      do {
                        iVar7 = rand();
                        *(int *)((long)puVar15 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 1600000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_2b8,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      lVar24 = 0;
                      do {
                        immutable::transient_rrb_push<int,false,6>
                                  ((immutable *)local_1f8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,
                                   *(int *)((long)puVar15 + lVar24 * 4));
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 400000);
                      immutable::vector<int,_false,_6>::vector
                                ((vector<int,_false,_6> *)local_280,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      local_1f8._0_8_ = local_2d8._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2d8._0_8_ = local_280._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                      pvVar16 = operator_new(0x82364);
                      memset(pvVar16,0,0x82364);
                      pvVar13 = operator_new(0x82364);
                      lVar24 = 0;
                      memset(pvVar13,0,0x82364);
                      do {
                        iVar7 = rand();
                        *(int *)((long)pvVar16 + lVar24 * 4) = iVar7;
                        uVar8 = rand();
                        *(uint *)((long)pvVar13 + lVar24 * 4) = uVar8 % 400000;
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 0x208d9);
                      local_290 = puVar15;
                      local_260 = pvVar13;
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_280,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      local_1f8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_280._0_8_;
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_280);
                      lVar24 = 0;
                      do {
                        uVar8 = *(uint *)((long)pvVar13 + lVar24 * 4);
                        immutable::transient_rrb_update<int,false,6>
                                  ((immutable *)local_1f8,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,uVar8,
                                   *(int *)((long)pvVar16 + lVar24 * 4));
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                        piVar12 = immutable::vector<int,_false,_6>::operator[]
                                            ((vector<int,_false,_6> *)local_2d8,uVar8);
                        iVar7 = *piVar12;
                        piVar14 = immutable::transient_rrb_nth<int,false,6>
                                            ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                             local_2b8,uVar8);
                        iVar28 = *piVar14;
                        TestEq<int,int>(iVar7,*(int *)((long)local_290 + (ulong)uVar8 * 4),
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x24e,
                                        "void (anonymous namespace)::test_transient_vector_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        TestEq<int,int>(iVar28,*(int *)((long)pvVar16 + lVar24 * 4),
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x24f,
                                        "void (anonymous namespace)::test_transient_vector_update(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        lVar24 = lVar24 + 1;
                        pvVar13 = local_260;
                      } while (lVar24 != 0x208d9);
                      operator_delete(local_260,0x82364);
                      operator_delete(pvVar16,0x82364);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      operator_delete(local_290,1600000);
                      pvVar13 = (void *)0x0;
                      do {
                        local_230 = pvVar13;
                        uVar8 = rand();
                        puVar15 = (undefined8 *)(ulong)(uVar8 % 0x32 + 0x20);
                        uVar8 = rand();
                        pvVar13 = (void *)(0x28 % (ulong)uVar8);
                        std::vector<int,_std::allocator<int>_>::vector
                                  ((vector<int,_std::allocator<int>_> *)local_1f8,(size_type)pvVar13
                                   ,(allocator_type *)local_2d8);
                        std::vector<int,_std::allocator<int>_>::vector
                                  ((vector<int,_std::allocator<int>_> *)local_2d8,(size_type)puVar15
                                   ,(allocator_type *)local_2b8);
                        if (pvVar13 != (void *)0x0) {
                          pvVar16 = (void *)0x0;
                          do {
                            iVar7 = rand();
                            *(int *)(local_1f8._0_8_ + (long)pvVar16 * 4) = iVar7 % 0x1000;
                            pvVar16 = (void *)((long)pvVar16 + 1);
                          } while (pvVar16 < pvVar13);
                        }
                        puVar32 = (undefined8 *)0x0;
                        do {
                          iVar7 = rand();
                          *(int *)(local_2d8._0_8_ + (long)puVar32 * 4) = iVar7 % 0x1000;
                          puVar32 = (undefined8 *)((long)puVar32 + 1);
                        } while (puVar15 != puVar32);
                        uVar8 = rand();
                        local_260 = pvVar13;
                        immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_280)
                        ;
                        immutable::vector<int,_false,_6>::vector
                                  ((vector<int,_false,_6> *)&local_250);
                        local_290 = puVar15;
                        immutable::transient_vector<int,_false,_6>::transient_vector
                                  ((transient_vector<int,_false,_6> *)&local_2e0,
                                   (ref<immutable::rrb<int,_false,_6>_> *)local_280);
                        iVar7 = (int)((ulong)uVar8 % (ulong)pvVar13);
                        if (iVar7 != 0) {
                          uVar30 = 0;
                          do {
                            immutable::transient_rrb_push<int,false,6>
                                      ((immutable *)local_2b8,
                                       (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0,
                                       *(uint *)(local_1f8._0_8_ + uVar30 * 4));
                            immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                      ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                            uVar30 = uVar30 + 1;
                          } while (uVar30 < (ulong)uVar8 % (ulong)pvVar13);
                        }
                        immutable::vector<int,_false,_6>::vector
                                  ((vector<int,_false,_6> *)&local_288,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                        local_2b8 = (undefined1  [8])local_280._0_8_;
                        if (local_288 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_280._0_4_ =
                             local_288.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_280._4_4_ =
                             local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                        immutable::transient_vector<int,_false,_6>::transient_vector
                                  ((transient_vector<int,_false,_6> *)&local_288,
                                   (ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                        _Var17 = local_2e0;
                        if (local_288 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2e0 = local_288;
                        _Var27 = local_2e0;
                        local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_2b8._0_4_ =
                             local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_2b8._4_4_ =
                             local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_2e0 = _Var27;
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_288);
                        iVar28 = (int)local_260;
                        uVar30 = 0;
                        do {
                          immutable::transient_rrb_push<int,false,6>
                                    ((immutable *)local_2b8,
                                     (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0,
                                     *(uint *)(local_1f8._0_8_ +
                                              (ulong)(uint)(iVar7 + (int)uVar30) * 4));
                          immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                          uVar30 = uVar30 + 1;
                        } while (uVar30 < (uint)(iVar28 - iVar7));
                        immutable::vector<int,_false,_6>::vector
                                  ((vector<int,_false,_6> *)&local_288,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                        _Var17 = local_250;
                        if (local_288 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_250 = local_288;
                        _Var27 = local_250;
                        local_250.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_250.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_2b8._0_4_ =
                             local_250.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_2b8._4_4_ =
                             local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_250 = _Var27;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                        immutable::operator+
                                  ((immutable *)&local_288,(vector<int,_false,_6> *)local_280,
                                   (vector<int,_false,_6> *)&local_250);
                        immutable::transient_vector<int,_false,_6>::transient_vector
                                  ((transient_vector<int,_false,_6> *)&local_258,
                                   (ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                        puVar15 = (undefined8 *)0x0;
                        do {
                          immutable::transient_rrb_push<int,false,6>
                                    ((immutable *)local_2b8,
                                     (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_258,
                                     *(uint *)(local_2d8._0_8_ + (long)puVar15 * 4));
                          immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                          puVar15 = (undefined8 *)((long)puVar15 + 1);
                        } while (local_290 != puVar15);
                        if (local_258 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          __function = 
                          "T *immutable::ref<immutable::transient_rrb<int, false, 6>>::operator->() const [T = immutable::transient_rrb<int, false, 6>]"
                          ;
                          goto LAB_0012b80b;
                        }
                        TestEq<unsigned_int,unsigned_int>
                                  ((int)local_290 + (int)local_260,*(uint *)local_258,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                   ,0x281,
                                   "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                  );
                        pvVar13 = (void *)0x0;
                        do {
                          piVar14 = immutable::transient_rrb_nth<int,false,6>
                                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                               &local_258,(uint32_t)pvVar13);
                          iVar7 = *piVar14;
                          piVar12 = immutable::vector<int,_false,_6>::operator[]
                                              ((vector<int,_false,_6> *)&local_288,(uint32_t)pvVar13
                                              );
                          iVar28 = *piVar12;
                          TestEq<int,int>(*(uint *)(local_1f8._0_8_ + (long)pvVar13 * 4),iVar7,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x288,
                                          "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          TestEq<int,int>(iVar28,iVar7,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x289,
                                          "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          pvVar16 = local_260;
                          pvVar13 = (void *)((long)pvVar13 + 1);
                        } while (pvVar13 < local_260);
                        puVar15 = (undefined8 *)0x0;
                        do {
                          piVar14 = immutable::transient_rrb_nth<int,false,6>
                                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                               &local_258,(int)puVar15 + (int)pvVar16);
                          TestEq<int,int>(*(uint *)(local_2d8._0_8_ + (long)puVar15 * 4),*piVar14,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x290,
                                          "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          puVar15 = (undefined8 *)((long)puVar15 + 1);
                        } while (local_290 != puVar15);
                        immutable::vector<int,_false,_6>::vector
                                  ((vector<int,_false,_6> *)&local_208,
                                   (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_258);
                        uVar8 = rand();
                        rand();
                        immutable::vector<int,_false,_6>::take
                                  ((vector<int,_false,_6> *)local_2b8,(size_type_conflict)&local_288
                                  );
                        immutable::vector<int,_false,_6>::drop
                                  ((vector<int,_false,_6> *)&local_218,
                                   (size_type_conflict)(vector<int,_false,_6> *)local_2b8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                        immutable::transient_vector<int,_false,_6>::transient_vector
                                  ((transient_vector<int,_false,_6> *)&local_200,
                                   (ref<immutable::rrb<int,_false,_6>_> *)&local_218);
                        _Var17 = local_258;
                        if (local_200 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_200 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_200 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_258 = local_200;
                        _Var27 = local_258;
                        local_258.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_258.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_2b8._0_4_ =
                             local_258.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_2b8._4_4_ =
                             local_258.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_258 = _Var27;
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_200);
                        puVar15 = (undefined8 *)0x0;
                        do {
                          immutable::transient_rrb_push<int,false,6>
                                    ((immutable *)local_2b8,
                                     (ref<immutable::transient_rrb<int,_false,_6>_> *)&local_258,
                                     *(uint *)(local_2d8._0_8_ + (long)puVar15 * 4));
                          immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                          puVar15 = (undefined8 *)((long)puVar15 + 1);
                        } while (local_290 != puVar15);
                        if (local_218 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                        goto LAB_0012b7f6;
                        uVar30 = 0;
                        while (uVar30 < *(uint *)local_218) {
                          index = (uint32_t)uVar30;
                          piVar14 = immutable::transient_rrb_nth<int,false,6>
                                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                               &local_258,index);
                          iVar7 = *piVar14;
                          piVar12 = immutable::vector<int,_false,_6>::operator[]
                                              ((vector<int,_false,_6> *)&local_218,index);
                          iVar28 = *piVar12;
                          TestEq<int,int>(*(uint *)(local_1f8._0_8_ +
                                                   (ulong)((int)((ulong)uVar8 %
                                                                ((ulong)pvVar16 & 0xffffffff)) +
                                                          index) * 4),iVar7,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x2a6,
                                          "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          TestEq<int,int>(iVar28,iVar7,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x2a7,
                                          "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          uVar30 = uVar30 + 1;
                          if (local_218 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                          goto LAB_0012b7f6;
                        }
                        puVar15 = (undefined8 *)0x0;
                        do {
                          if (local_218 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                          goto LAB_0012b7f6;
                          piVar14 = immutable::transient_rrb_nth<int,false,6>
                                              ((ref<immutable::transient_rrb<int,_false,_6>_> *)
                                               &local_258,*(uint *)local_218 + (int)puVar15);
                          TestEq<int,int>(*(uint *)(local_2d8._0_8_ + (long)puVar15 * 4),*piVar14,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x2ae,
                                          "void (anonymous namespace)::test_transient_vector_push_2(uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          puVar15 = (undefined8 *)((long)puVar15 + 1);
                        } while (local_290 != puVar15);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)&local_218);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)&local_208);
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_258);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                        immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          operator_delete((void *)local_2d8._0_8_,(long)_Stack_2c8 - local_2d8._0_8_
                                         );
                        }
                        pvVar13 = local_230;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          operator_delete((void *)local_1f8._0_8_,(long)_Stack_1e8 - local_1f8._0_8_
                                         );
                        }
                        uVar8 = (int)pvVar13 + 1;
                        pvVar13 = (void *)(ulong)uVar8;
                      } while (uVar8 != 400);
                      piVar14 = (int *)operator_new(40000);
                      lVar24 = 0;
                      memset(piVar14,0,40000);
                      do {
                        iVar7 = rand();
                        *(int *)((long)piVar14 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 40000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                      lVar24 = 0;
                      do {
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8
                                  );
                        local_1f8._0_8_ = local_2b8;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2b8 = (undefined1  [8])local_2d8._0_8_;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 10000);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_280,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      uVar1 = local_280._0_8_;
                      local_2d8._0_8_ = local_280._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 2;
                      }
                      local_1f8._0_8_ = local_280._0_8_;
                      local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffff00000000;
                      _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                      _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           0xffffffff;
                      local_1e0._M_head_impl = (int *)0x0;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::end
                                ((iterator *)local_2d8,(transient_vector<int,_false,_6> *)local_280)
                      ;
                      if ((local_2d8._8_4_ != 0) || (uVar1 != local_2d8._0_8_)) {
                        piVar31 = piVar14;
                        do {
                          do {
                            piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                                ((vector_iterator<int,_false,_6> *)local_1f8);
                            TestEq<int,int>(*piVar18,*piVar31,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                            ,0x2ca,
                                            "void (anonymous namespace)::test_transient_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                           );
                            _Var11._M_head_impl = local_1f8._8_4_ + 1;
                            local_1f8._8_4_ = _Var11._M_head_impl;
                            piVar31 = piVar31 + 1;
                          } while (_Var11._M_head_impl != local_2d8._8_4_);
                        } while (local_1f8._0_8_ != local_2d8._0_8_);
                      }
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_280);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      operator_delete(piVar14,40000);
                      pvVar13 = operator_new(4000);
                      memset(pvVar13,0,4000);
                      pvVar16 = operator_new(4000);
                      memset(pvVar16,0,4000);
                      puVar15 = (undefined8 *)operator_new(4000);
                      memset(puVar15,0,4000);
                      pvVar19 = operator_new(4000);
                      local_58 = (long)pvVar13 + 4000;
                      local_60 = (long)pvVar16 + 4000;
                      lVar24 = 0;
                      memset(pvVar19,0,4000);
                      do {
                        iVar7 = rand();
                        *(int *)((long)pvVar13 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 4000);
                      lVar24 = 0;
                      do {
                        iVar7 = rand();
                        *(int *)((long)pvVar16 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 4000);
                      lVar24 = 0;
                      do {
                        iVar7 = rand();
                        *(int *)((long)puVar15 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 4000);
                      lVar24 = 0;
                      do {
                        iVar7 = rand();
                        *(int *)((long)pvVar19 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 4000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_280);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                      local_210 = pvVar16;
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_2e0);
                      local_290 = puVar15;
                      local_230 = pvVar13;
                      local_68 = puVar15 + 500;
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_288);
                      local_70 = (long)pvVar19 + 4000;
                      lVar24 = 0;
                      local_260 = pvVar19;
                      do {
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_280
                                  );
                        local_1f8._0_8_ = local_280._0_8_;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_280._0_8_ = local_2d8._0_8_;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,
                                   (value_type_conflict)&local_250);
                        _Var17 = local_250;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_250.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                        local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2d8._4_4_;
                        _Var27 = local_250;
                        local_250.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_250.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_250.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_250 = _Var27;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,
                                   (value_type_conflict)&local_2e0);
                        _Var17 = local_2e0;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                        local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2d8._4_4_;
                        _Var27 = local_2e0;
                        local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_2e0 = _Var27;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,
                                   (value_type_conflict)&local_288);
                        _Var17 = local_288;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_288.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                        local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2d8._4_4_;
                        _Var27 = local_288;
                        local_288.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_288.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_288.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_288 = _Var27;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        pvVar13 = local_230;
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 1000);
                      local_2b8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x0;
                      local_2b8._4_4_ = 0;
                      _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0x0;
                      _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                      local_2a8.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0x0;
                      local_2a8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                      std::vector<int,std::allocator<int>>::
                      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                ((vector<int,std::allocator<int>> *)local_2b8,0,local_230,local_58);
                      pvVar16 = local_210;
                      std::vector<int,std::allocator<int>>::
                      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_210,
                                 local_60);
                      std::vector<int,std::allocator<int>>::
                      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_290,
                                 local_68);
                      std::vector<int,std::allocator<int>>::
                      _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                ((vector<int,std::allocator<int>> *)local_2b8,_Stack_2b0,local_260,
                                 local_70);
                      immutable::operator+
                                ((immutable *)local_2d8,(vector<int,_false,_6> *)local_280,
                                 (vector<int,_false,_6> *)&local_250);
                      immutable::operator+
                                ((immutable *)local_1f8,(vector<int,_false,_6> *)local_2d8,
                                 (vector<int,_false,_6> *)&local_2e0);
                      immutable::operator+
                                ((immutable *)&local_258,(vector<int,_false,_6> *)local_1f8,
                                 (vector<int,_false,_6> *)&local_288);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)&local_208,
                                 (ref<immutable::rrb<int,_false,_6>_> *)&local_258);
                      _Var27 = local_208;
                      _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8;
                      local_2d8._0_4_ =
                           local_208.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_2d8._4_4_ =
                           local_208.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      if (local_208 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)((long)local_208 + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)((long)local_208 + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 2;
                      }
                      local_1f8._0_4_ =
                           local_208.super__Tuple_impl<2UL,_unsigned_int>.
                           super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._4_4_ =
                           local_208.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffff00000000;
                      _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                      _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           0xffffffff;
                      local_1e0._M_head_impl = (int *)0x0;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::end
                                ((iterator *)local_2d8,(transient_vector<int,_false,_6> *)&local_208
                                );
                      if ((local_2d8._8_4_ != 0) ||
                         (_Var27 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_))
                      {
                        do {
                          do {
                            piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                                ((vector_iterator<int,_false,_6> *)local_1f8);
                            TestEq<int,int>(*piVar18,*(uint *)_Var17,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                            ,0x2f6,
                                            "void (anonymous namespace)::test_transient_iterator_2(uint32_t) [atomic_ref_counting = false, N = 6]"
                                           );
                            _Var11._M_head_impl = local_1f8._8_4_ + 1;
                            local_1f8._8_4_ = _Var11._M_head_impl;
                            _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                                     ((long)_Var17 + 4);
                          } while (_Var11._M_head_impl != local_2d8._8_4_);
                        } while (local_1f8._0_8_ != local_2d8._0_8_);
                      }
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_208);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_258);
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
                      }
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                      operator_delete(local_260,4000);
                      operator_delete(local_290,4000);
                      operator_delete(pvVar16,4000);
                      operator_delete(pvVar13,4000);
                      piVar14 = (int *)operator_new(40000);
                      lVar24 = 0;
                      memset(piVar14,0,40000);
                      do {
                        iVar7 = rand();
                        *(int *)((long)piVar14 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 40000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2b8);
                      lVar24 = 0;
                      do {
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,(value_type_conflict)local_2b8
                                  );
                        local_1f8._0_8_ = local_2b8;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2b8 = (undefined1  [8])local_2d8._0_8_;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 10000);
                      memmove(piVar14 + 0x9c4,piVar14 + 5000,20000);
                      immutable::vector<int,_false,_6>::erase
                                ((vector<int,_false,_6> *)local_2d8,(size_type_conflict)local_2b8,
                                 0x9c4);
                      local_1f8._0_8_ = local_2b8;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2b8 = (undefined1  [8])local_2d8._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_280,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      uVar1 = local_280._0_8_;
                      local_2d8._0_8_ = local_280._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 2;
                      }
                      local_1f8._0_8_ = local_280._0_8_;
                      local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffff00000000;
                      _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                      super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                      _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           0xffffffff;
                      local_1e0._M_head_impl = (int *)0x0;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::end
                                ((iterator *)local_2d8,(transient_vector<int,_false,_6> *)local_280)
                      ;
                      if ((local_2d8._8_4_ != 0) || (uVar1 != local_2d8._0_8_)) {
                        piVar31 = piVar14;
                        do {
                          do {
                            piVar18 = immutable::vector_iterator<int,_false,_6>::operator*
                                                ((vector_iterator<int,_false,_6> *)local_1f8);
                            TestEq<int,int>(*piVar18,*piVar31,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                            ,0x314,
                                            "void (anonymous namespace)::test_transient_iterator_3(uint32_t) [atomic_ref_counting = false, N = 6]"
                                           );
                            _Var11._M_head_impl = local_1f8._8_4_ + 1;
                            local_1f8._8_4_ = _Var11._M_head_impl;
                            piVar31 = piVar31 + 1;
                          } while (_Var11._M_head_impl != local_2d8._8_4_);
                        } while (local_1f8._0_8_ != local_2d8._0_8_);
                      }
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_280);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      operator_delete(piVar14,40000);
                      pvVar13 = operator_new(40000);
                      lVar24 = 0;
                      memset(pvVar13,0,40000);
                      do {
                        iVar7 = rand();
                        *(int *)((long)pvVar13 + lVar24) = iVar7;
                        lVar24 = lVar24 + 4;
                      } while (lVar24 != 40000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                      lVar24 = 0;
                      do {
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,
                                   (value_type_conflict)&local_250);
                        _Var17 = local_250;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_250.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                        local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2d8._4_4_;
                        _Var27 = local_250;
                        local_250.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_250.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_250.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_250 = _Var27;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 10000);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)&local_2e0,
                                 (ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                      immutable::transient_vector<int,_false,_6>::rbegin
                                ((reverse_iterator *)local_2b8,
                                 (transient_vector<int,_false,_6> *)&local_2e0);
                      immutable::transient_vector<int,_false,_6>::rend
                                ((reverse_iterator *)local_280,
                                 (transient_vector<int,_false,_6> *)&local_2e0);
                      piVar14 = (int *)((long)pvVar13 + 0x9c3c);
                      while( true ) {
                        uVar3 = local_280._8_4_;
                        uVar1 = local_280._0_8_;
                        auVar2 = local_2b8;
                        local_1f8._0_8_ = local_2b8;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_1e0._M_head_impl = local_2a0._M_head_impl;
                        local_1f8._8_4_ =
                             _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._12_4_ =
                             _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        uVar4 = local_1f8._8_8_;
                        _Stack_1e8 = local_2a8;
                        local_2d8._0_8_ = local_280._0_8_;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2c0._M_head_impl = local_268._M_head_impl;
                        local_2d8._12_4_ = local_280._12_4_;
                        local_2d8._8_4_ = local_280._8_4_;
                        _Stack_2c8 = _Stack_270;
                        local_1f8._8_4_ =
                             _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        uVar5 = local_1f8._8_4_;
                        local_1f8._8_8_ = uVar4;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        if ((auVar2 == (undefined1  [8])uVar1) && (uVar5 == uVar3)) break;
                        piVar20 = std::reverse_iterator<immutable::vector_iterator<int,_false,_6>_>
                                  ::operator*((reverse_iterator<immutable::vector_iterator<int,_false,_6>_>
                                               *)local_2b8);
                        TestEq<int,int>(*piVar20,*piVar14,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x32f,
                                        "void (anonymous namespace)::test_transient_reverse_iterator(uint32_t) [atomic_ref_counting = false, N = 6]"
                                       );
                        _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)
                             ((int)_Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                                   super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + -1);
                        piVar14 = piVar14 + -1;
                      }
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)&local_2e0);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                      operator_delete(pvVar13,40000);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)&local_250);
                      iVar7 = 400;
                      do {
                        rand();
                        immutable::vector<int,_false,_6>::push_back
                                  ((vector<int,_false,_6> *)local_2d8,
                                   (value_type_conflict)&local_250);
                        _Var17 = local_250;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_250.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                        local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2d8._4_4_;
                        _Var27 = local_250;
                        local_250.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_250.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_250.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_250 = _Var27;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        iVar7 = iVar7 + -1;
                      } while (iVar7 != 0);
                      std::
                      vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                      ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                *)local_1f8,0x35,(allocator_type *)local_2d8);
                      lVar24 = 0;
                      do {
                        rand();
                        rand();
                        immutable::vector<int,_false,_6>::take
                                  ((vector<int,_false,_6> *)local_280,(size_type_conflict)&local_250
                                  );
                        immutable::vector<int,_false,_6>::drop
                                  ((vector<int,_false,_6> *)local_2b8,
                                   (size_type_conflict)(vector<int,_false,_6> *)local_280);
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2d8._0_8_ =
                             *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                              (local_1f8._0_8_ + lVar24 * 8);
                        p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                  (local_1f8._0_8_ + lVar24 * 8);
                        p_Var22->super__Tuple_impl<2UL,_unsigned_int> =
                             (_Tuple_impl<2UL,_unsigned_int>)local_2b8._0_4_;
                        p_Var22->super__Head_base<1UL,_unsigned_int,_false> =
                             (_Head_base<1UL,_unsigned_int,_false>)local_2b8._4_4_;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 0x35);
                      puVar15 = (undefined8 *)0x0;
                      do {
                        uVar8 = rand();
                        immutable::vector<int,_false,_6>::vector
                                  ((vector<int,_false,_6> *)&local_2e0);
                        uVar30 = (ulong)(uVar8 % 10);
                        std::
                        vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                        ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                  *)local_2d8,uVar30,(allocator_type *)local_2b8);
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8,
                                   uVar30,(allocator_type *)local_280);
                        if (uVar8 % 10 != 0) {
                          uVar26 = 0;
                          do {
                            uVar8 = rand();
                            *(uint *)((long)local_2b8 + uVar26 * 4) = uVar8 % 0x35;
                            immutable::operator+
                                      ((immutable *)&local_288,(vector<int,_false,_6> *)&local_2e0,
                                       (vector<int,_false,_6> *)
                                       ((ulong)((uVar8 % 0x35) * 8) + local_1f8._0_8_));
                            _Var17 = local_2e0;
                            if (local_288 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_2e0 = local_288;
                            _Var27 = local_2e0;
                            local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                                 _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                                 _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            local_280._0_4_ =
                                 local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_280._4_4_ =
                                 local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            local_2e0 = _Var27;
                            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<int,_false,_6>_> *)&local_288);
                            if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_280._0_8_ =
                                 *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                  (local_2d8._0_8_ + uVar26 * 8);
                            *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                             (local_2d8._0_8_ + uVar26 * 8) = local_2e0;
                            immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                            uVar26 = uVar26 + 1;
                          } while (uVar30 != uVar26);
                        }
                        local_290 = puVar15;
                        if (local_2e0 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                        goto LAB_0012b7f6;
                        uVar30 = 0;
                        uVar8 = 0;
                        while (puVar15 = local_290, uVar8 < *(uint *)local_2e0) {
                          local_280._0_8_ =
                               *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                (local_1f8._0_8_ +
                                (ulong)*(uint *)((long)local_2b8 + uVar30 * 4) * 8);
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ ==
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012b7f6;
                          (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                          index_00 = 0;
                          while (index_00 < *(uint *)local_280._0_8_) {
                            piVar12 = immutable::vector<int,_false,_6>::operator[]
                                                ((vector<int,_false,_6> *)local_280,index_00);
                            iVar7 = *piVar12;
                            piVar12 = immutable::vector<int,_false,_6>::operator[]
                                                ((vector<int,_false,_6> *)&local_2e0,
                                                 uVar8 + index_00);
                            TestEq<int,int>(iVar7,*piVar12,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                            ,0x35b,
                                            "void (anonymous namespace)::test_catslice(uint32_t, uint32_t, uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                           );
                            index_00 = index_00 + 1;
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ ==
                                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                            goto LAB_0012b7f6;
                          }
                          uVar30 = (ulong)((int)uVar30 + 1);
                          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                          uVar8 = uVar8 + index_00;
                          if (local_2e0 == (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0)
                          goto LAB_0012b7f6;
                        }
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
                        }
                        std::
                        vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                        ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                   *)local_2d8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)&local_2e0);
                        uVar8 = (int)puVar15 + 1;
                        puVar15 = (undefined8 *)(ulong)uVar8;
                      } while (uVar8 != 0x906);
                      std::
                      vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                      ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                 *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)&local_250);
                      std::
                      vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                      ::vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                *)local_1f8,0xa28,(allocator_type *)local_2d8);
                      lVar24 = 0;
                      do {
                        uVar8 = rand();
                        for (uVar8 = uVar8 & 0xf; uVar8 != 0; uVar8 = uVar8 - 1) {
                          _Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               SUB84(local_1f8._0_8_,0);
                          rand();
                          immutable::vector<int,_false,_6>::push_back
                                    ((vector<int,_false,_6> *)local_2b8,
                                     (int)lVar24 * 8 +
                                     (int)_Var9.super__Head_base<2UL,_unsigned_int,_false>.
                                          _M_head_impl);
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2d8._0_8_ =
                               *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                (local_1f8._0_8_ + lVar24 * 8);
                          p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                    (local_1f8._0_8_ + lVar24 * 8);
                          p_Var22->super__Tuple_impl<2UL,_unsigned_int> =
                               (_Tuple_impl<2UL,_unsigned_int>)local_2b8._0_4_;
                          p_Var22->super__Head_base<1UL,_unsigned_int,_false> =
                               (_Head_base<1UL,_unsigned_int,_false>)local_2b8._4_4_;
                          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                          immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                        }
                        lVar24 = lVar24 + 1;
                      } while (lVar24 != 200);
                      lVar24 = 0;
                      do {
                        immutable::operator+
                                  ((immutable *)local_2b8,
                                   (vector<int,_false,_6> *)(local_1f8._0_8_ + lVar24),
                                   (vector<int,_false,_6> *)((char *)(local_1f8._0_8_ + lVar24) + 8)
                                  );
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2d8._0_8_ =
                             *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                              ((long)&((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                      (local_1f8._0_8_ + 0x640))->cnt + lVar24);
                        p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                  ((long)&((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                          (local_1f8._0_8_ + 0x640))->cnt + lVar24);
                        p_Var22->super__Tuple_impl<2UL,_unsigned_int> =
                             (_Tuple_impl<2UL,_unsigned_int>)local_2b8._0_4_;
                        p_Var22->super__Head_base<1UL,_unsigned_int,_false> =
                             (_Head_base<1UL,_unsigned_int,_false>)local_2b8._4_4_;
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                        lVar24 = lVar24 + 8;
                      } while (lVar24 != 0x4b00);
                      puVar15 = (undefined8 *)0xc8;
                      do {
                        local_2d8._0_8_ =
                             *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                              (local_1f8._0_8_ + (long)puVar15 * 8);
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2b8 = *(undefined1 (*) [8])
                                     (&((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                       (local_1f8._0_8_ + -0x640))->cnt + (long)puVar15 * 2);
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_280._0_8_ =
                             *(_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                              ((uint32_t *)(local_1f8._0_8_ + -0x638) + (long)puVar15 * 2);
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_290 = puVar15;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012b7f6;
                        uVar8 = 0;
                        while (uVar8 < *(uint *)local_2b8) {
                          piVar12 = immutable::vector<int,_false,_6>::operator[]
                                              ((vector<int,_false,_6> *)local_2b8,uVar8);
                          iVar7 = *piVar12;
                          piVar12 = immutable::vector<int,_false,_6>::operator[]
                                              ((vector<int,_false,_6> *)local_2d8,uVar8);
                          TestEq<int,int>(iVar7,*piVar12,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x37e,
                                          "void (anonymous namespace)::test_fibocat(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          uVar8 = uVar8 + 1;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 ==
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012b7f6;
                        }
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ ==
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012b7f6;
                        sVar10 = 0;
                        while (sVar10 < *(uint *)local_280._0_8_) {
                          piVar12 = immutable::vector<int,_false,_6>::operator[]
                                              ((vector<int,_false,_6> *)local_280,sVar10);
                          iVar7 = *piVar12;
                          piVar12 = immutable::vector<int,_false,_6>::operator[]
                                              ((vector<int,_false,_6> *)local_2d8,sVar10 + uVar8);
                          TestEq<int,int>(iVar7,*piVar12,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                          ,0x385,
                                          "void (anonymous namespace)::test_fibocat(uint32_t, uint32_t) [atomic_ref_counting = false, N = 6]"
                                         );
                          sVar10 = sVar10 + 1;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ ==
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) goto LAB_0012b7f6;
                        }
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                        puVar15 = (undefined8 *)((long)local_290 + 1);
                      } while (puVar15 != (undefined8 *)0xa28);
                      std::
                      vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                      ::~vector((vector<immutable::vector<int,_false,_6>,_std::allocator<immutable::vector<int,_false,_6>_>_>
                                 *)local_1f8);
                      immutable::vector<int,_false,_6>::vector((vector<int,_false,_6> *)local_2d8);
                      immutable::transient_vector<int,_false,_6>::transient_vector
                                ((transient_vector<int,_false,_6> *)local_2b8,
                                 (ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      immutable::transient_rrb_push<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,0);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      immutable::transient_rrb_push<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,1);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      immutable::transient_rrb_push<int,false,6>
                                ((immutable *)local_1f8,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,2);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_1f8);
                      immutable::vector<int,_false,_6>::vector
                                ((vector<int,_false,_6> *)local_280,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      local_1f8._0_8_ = local_2d8._0_8_;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                        super___atomic_base<unsigned_int>)._M_i =
                             (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                             super___atomic_base<unsigned_int>)._M_i + 1;
                      }
                      local_2d8._0_8_ = local_280._0_8_;
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_1f8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_280);
                      immutable::transient_rrb_push<int,false,6>
                                ((immutable *)&local_38,
                                 (ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8,3);
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref(&local_38);
                      TestEq<bool,bool>(true,false,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x39c,
                                        "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                       );
                      piVar12 = immutable::vector<int,_false,_6>::at
                                          ((vector<int,_false,_6> *)local_2d8,0);
                      TestEq<int,int>(0,*piVar12,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x39d,
                                      "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                     );
                      piVar12 = immutable::vector<int,_false,_6>::at
                                          ((vector<int,_false,_6> *)local_2d8,1);
                      TestEq<int,int>(1,*piVar12,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x39e,
                                      "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                     );
                      piVar12 = immutable::vector<int,_false,_6>::at
                                          ((vector<int,_false,_6> *)local_2d8,2);
                      TestEq<int,int>(2,*piVar12,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                      ,0x39f,
                                      "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                     );
                      immutable::vector<int,_false,_6>::at((vector<int,_false,_6> *)local_2d8,3);
                      TestEq<bool,bool>(true,false,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                        ,0x3a9,
                                        "void (anonymous namespace)::test_invalid_states() [atomic_ref_counting = false, N = 6]"
                                       );
                      immutable::ref<immutable::transient_rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::transient_rrb<int,_false,_6>_> *)local_2b8);
                      immutable::ref<immutable::rrb<int,_false,_6>_>::~ref
                                ((ref<immutable::rrb<int,_false,_6>_> *)local_2d8);
                      test_erase<false,6>(10000,0x9c4);
                      test_concat<false,6>(2000);
                      immutable::vector<char,_false,_6>::vector((vector<char,_false,_6> *)local_2b8)
                      ;
                      immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::vector
                                ((vector<immutable::vector<char,_false,_6>,_true,_5> *)local_280);
                      iVar7 = 0;
                      do {
                        iVar28 = 3;
                        do {
                          immutable::vector<char,_false,_6>::push_back
                                    ((vector<char,_false,_6> *)local_2d8,(value_type)local_2b8);
                          local_1f8._0_8_ = local_2b8;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2b8 = (undefined1  [8])local_2d8._0_8_;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                          iVar28 = iVar28 + -1;
                        } while (iVar28 != 0);
                        local_250.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2b8._0_4_;
                        local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2b8._4_4_;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::push_back
                                  ((vector<immutable::vector<char,_false,_6>,_true,_5> *)local_1f8,
                                   (value_type *)local_280);
                        immutable::ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>
                        ::operator=((ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>
                                     *)local_280,
                                    (ref<immutable::rrb<immutable::vector<char,_false,_6>,_true,_5>_>
                                     *)local_1f8);
                        immutable::rrb_details::release<immutable::vector<char,false,6>,5>
                                  ((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                   local_1f8._0_8_);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                        iVar7 = iVar7 + 1;
                      } while (iVar7 != 0x1e);
                      p_Var22 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)
                                immutable::vector<immutable::vector<char,_false,_6>,_true,_5>::back
                                          ((vector<immutable::vector<char,_false,_6>,_true,_5> *)
                                           local_280);
                      local_1f8._0_8_ = *p_Var22;
                      if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
                          (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                        local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffff00000000;
                        _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                        _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             0xffffffff;
                        local_1e0._M_head_impl = (int *)0x0;
                        *(uint *)(local_1f8._0_8_ + 0x20) = *(uint *)(local_1f8._0_8_ + 0x20) + 2;
                        local_2d8._8_4_ = *(uint *)local_1f8._0_8_;
                        _Stack_2c8.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                        _Stack_2c8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             0xffffffff;
                        local_2c0._M_head_impl = (int *)0x0;
                        local_2d8._0_8_ = local_1f8._0_8_;
                        if (*(uint *)local_1f8._0_8_ != 0) {
                          do {
                            do {
                              pcVar23 = immutable::vector_iterator<char,_false,_6>::operator*
                                                  ((vector_iterator<char,_false,_6> *)local_1f8);
                              TestEq<char,char>('a',*pcVar23,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                                ,0x3bb,
                                                "void (anonymous namespace)::test_vector_of_vector() [atomic_ref_counting = false, N = 6]"
                                               );
                              _Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                                   (_Head_base<2UL,_unsigned_int,_false>)(local_1f8._8_4_ + 1);
                              local_1f8._8_4_ =
                                   _Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            } while (_Var9.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl
                                     != (_Head_base<2UL,_unsigned_int,_false>)local_2d8._8_4_);
                          } while (local_1f8._0_8_ != local_2d8._0_8_);
                        }
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                        immutable::rrb_details::release<immutable::vector<char,false,6>,5>
                                  ((rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                   local_280._0_8_);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                        immutable::vector<char,_false,_6>::vector
                                  ((vector<char,_false,_6> *)&local_2e0);
                        immutable::vector<char,_false,_6>::vector
                                  ((vector<char,_false,_6> *)&local_288);
                        immutable::transient_vector<char,_false,_6>::transient_vector
                                  ((transient_vector<char,_false,_6> *)&local_258,
                                   (ref<immutable::rrb<char,_false,_6>_> *)&local_288);
                        local_2d8._0_8_ = &_Stack_2c8;
                        local_1f8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x1b;
                        local_1f8._4_4_ = 0;
                        _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                                 std::__cxx11::string::_M_create
                                           ((ulong *)local_2d8,(ulong)local_1f8);
                        uVar1 = local_1f8._0_8_;
                        _Stack_2c8.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_1f8._0_4_;
                        _Stack_2c8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_1f8._4_4_;
                        builtin_strncpy((char *)((long)_Var17 + 0xb)," eerste ",8);
                        builtin_strncpy((char *)((long)_Var17 + 0x13),"lijntje ",8);
                        *(undefined8 *)_Var17 = 0x6d20736920746944;
                        *(undefined8 *)((long)_Var17 + 8) = 0x73726565206e6a69;
                        local_2d8._8_8_ = local_1f8._0_8_;
                        *(char *)((long)_Var17 + local_1f8._0_8_) = '\0';
                        local_2d8._0_8_ = _Var17;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          _Var27.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)0x0;
                          _Var27.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                          do {
                            immutable::transient_rrb_push<char,false,6>
                                      ((immutable *)local_1f8,
                                       (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_258,
                                       *(char *)((long)_Var17 + (long)_Var27));
                            immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::transient_rrb<char,_false,_6>_> *)local_1f8);
                            _Var27 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                                     ((long)_Var27 + 1);
                          } while ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)uVar1 != _Var27);
                        }
                        immutable::vector<char,_false,_6>::vector
                                  ((vector<char,_false,_6> *)local_2b8,
                                   (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_258);
                        _Var17 = local_288;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_288.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2b8._0_4_;
                        local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2b8._4_4_;
                        _Var27 = local_288;
                        local_288.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_288.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_288.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_288.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_288 = _Var27;
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                        local_208 = local_288;
                        if (local_288 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_288 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        immutable::vector<char,_false,_6>::insert
                                  ((vector<char,_false,_6> *)local_2b8,
                                   (size_type_conflict)&local_2e0,(vector<char,_false,_6> *)0x0);
                        _Var17 = local_2e0;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_2b8._0_4_;
                        local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_2b8._4_4_;
                        _Var27 = local_2e0;
                        local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_2e0 = _Var27;
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)&local_208);
                        immutable::vector<char,_false,_6>::vector
                                  ((vector<char,_false,_6> *)&local_218);
                        immutable::transient_vector<char,_false,_6>::transient_vector
                                  ((transient_vector<char,_false,_6> *)&local_200,
                                   (ref<immutable::rrb<char,_false,_6>_> *)&local_218);
                        local_1f8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x1b;
                        local_1f8._4_4_ = 0;
                        local_2b8 = (undefined1  [8])&local_2a8;
                        _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                                 std::__cxx11::string::_M_create
                                           ((ulong *)local_2b8,(ulong)local_1f8);
                        uVar1 = local_1f8._0_8_;
                        local_2a8.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_1f8._0_4_;
                        local_2a8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_1f8._4_4_;
                        builtin_strncpy((char *)((long)_Var17 + 0xb)," tweede ",8);
                        builtin_strncpy((char *)((long)_Var17 + 0x13),"lijntje ",8);
                        *(undefined8 *)_Var17 = 0x6d20736920746944;
                        *(undefined8 *)((long)_Var17 + 8) = 0x65657774206e6a69;
                        _Stack_2b0.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_1f8._0_4_;
                        _Stack_2b0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_1f8._4_4_;
                        *(char *)((long)_Var17 + local_1f8._0_8_) = '\0';
                        local_2b8 = (undefined1  [8])_Var17;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_1f8._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          _Var29.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)0x0;
                          _Var29.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                          do {
                            immutable::transient_rrb_push<char,false,6>
                                      ((immutable *)local_1f8,
                                       (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_200,
                                       *(char *)((long)_Var17 + (long)_Var29));
                            immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::transient_rrb<char,_false,_6>_> *)local_1f8);
                            _Var29 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                                     ((long)_Var29 + 1);
                          } while ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)uVar1 != _Var29);
                        }
                        immutable::vector<char,_false,_6>::vector
                                  ((vector<char,_false,_6> *)local_280,
                                   (ref<immutable::transient_rrb<char,_false,_6>_> *)&local_200);
                        _Var17 = local_218;
                        if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                            (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                          super___atomic_base<unsigned_int>)._M_i =
                               (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                               super___atomic_base<unsigned_int>)._M_i + 1;
                        }
                        local_218.super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<2UL,_unsigned_int,_false>)
                             (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                        local_218.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             local_280._4_4_;
                        _Var27 = local_218;
                        local_218.super__Tuple_impl<2UL,_unsigned_int> =
                             _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_218.super__Head_base<1UL,_unsigned_int,_false> =
                             _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._0_4_ =
                             local_218.super__Tuple_impl<2UL,_unsigned_int>.
                             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                        local_1f8._4_4_ =
                             local_218.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                        local_218 = _Var27;
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                        immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                  ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                        if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                          uVar8 = *(uint *)local_2e0;
                          local_40 = local_218;
                          if (local_218 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)((long)local_218 + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)((long)local_218 + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          immutable::vector<char,_false,_6>::insert
                                    ((vector<char,_false,_6> *)local_280,
                                     (size_type_conflict)&local_2e0,
                                     (vector<char,_false,_6> *)(ulong)uVar8);
                          _Var17 = local_2e0;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_2e0;
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)&local_40);
                          immutable::vector<char,_false,_6>::vector
                                    ((vector<char,_false,_6> *)&local_228);
                          immutable::vector<char,_false,_6>::push_back
                                    ((vector<char,_false,_6> *)local_280,(value_type)&local_228);
                          _Var17 = local_228;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_228.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_228;
                          local_228.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_228.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_228.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_228 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::vector<char,_false,_6>::push_back
                                    ((vector<char,_false,_6> *)local_280,(value_type)&local_228);
                          _Var17 = local_228;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_228.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_228;
                          local_228.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_228.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_228.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_228 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::vector<char,_false,_6>::push_back
                                    ((vector<char,_false,_6> *)local_280,(value_type)&local_228);
                          _Var17 = local_228;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_228.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_228;
                          local_228.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_228.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_228.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_228 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::vector<char,_false,_6>::push_back
                                    ((vector<char,_false,_6> *)local_280,(value_type)&local_228);
                          _Var17 = local_228;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_228.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_228;
                          local_228.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_228.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_228.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_228 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::vector<char,_false,_6>::push_back
                                    ((vector<char,_false,_6> *)local_280,(value_type)&local_228);
                          _Var17 = local_228;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_228.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_228;
                          local_228.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_228.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_228.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_228 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::vector<char,_false,_6>::push_back
                                    ((vector<char,_false,_6> *)local_280,(value_type)&local_228);
                          _Var17 = local_228;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_228.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_228;
                          local_228.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_228.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_228.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_228 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::vector<char,_false,_6>::erase
                                    ((vector<char,_false,_6> *)local_280,
                                     (size_type_conflict)&local_2e0,0);
                          _Var17 = local_2e0;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_2e0;
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          local_48 = local_228;
                          if (local_228 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          immutable::vector<char,_false,_6>::insert
                                    ((vector<char,_false,_6> *)local_280,
                                     (size_type_conflict)&local_2e0,(vector<char,_false,_6> *)0x0);
                          _Var17 = local_2e0;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_2e0;
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)&local_48);
                          immutable::vector<char,_false,_6>::set
                                    ((vector<char,_false,_6> *)local_280,
                                     (size_type_conflict)&local_228,'\0');
                          _Var17 = local_228;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_228.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_228;
                          local_228.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_228.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_228.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_228.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_228 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::vector<char,_false,_6>::erase
                                    ((vector<char,_false,_6> *)local_280,
                                     (size_type_conflict)&local_2e0,0x1e);
                          _Var17 = local_2e0;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_2e0;
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          local_50 = local_228;
                          if (local_228 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)((long)local_228 + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          immutable::vector<char,_false,_6>::insert
                                    ((vector<char,_false,_6> *)local_280,
                                     (size_type_conflict)&local_2e0,(vector<char,_false,_6> *)0x1e);
                          _Var17 = local_2e0;
                          if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_ !=
                              (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)(local_280._0_8_ + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 1;
                          }
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<2UL,_unsigned_int,_false>)
                               (_Head_base<2UL,_unsigned_int,_false>)local_280._0_4_;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               local_280._4_4_;
                          _Var27 = local_2e0;
                          local_2e0.super__Tuple_impl<2UL,_unsigned_int> =
                               _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0.super__Head_base<1UL,_unsigned_int,_false> =
                               _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._0_4_ =
                               local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_1f8._4_4_ =
                               local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          local_2e0 = _Var27;
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_1f8);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                          immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                    ((ref<immutable::rrb<char,_false,_6>_> *)&local_50);
                          std::__cxx11::stringstream::stringstream((stringstream *)local_1f8);
                          local_280._0_4_ =
                               local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                               super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                          local_280._4_4_ =
                               local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                          if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                            local_280._8_4_ = 0;
                            _Stack_270.super__Tuple_impl<2UL,_unsigned_int>.
                            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                                 (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
                            _Stack_270.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                 0xffffffff;
                            local_268._M_head_impl = (int *)0x0;
                            local_250 = local_2e0;
                            (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                            super___atomic_base<unsigned_int>)._M_i =
                                 (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                                 super___atomic_base<unsigned_int>)._M_i + 2;
                            local_248 = *(uint *)local_2e0;
                            local_240 = 0xffffffffffffffff;
                            local_238 = 0;
                            if (local_248 != 0) {
                              do {
                                do {
                                  pcVar23 = immutable::vector_iterator<char,_false,_6>::operator*
                                                      ((vector_iterator<char,_false,_6> *)local_280)
                                  ;
                                  local_219 = *pcVar23;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&_Stack_1e8,&local_219,1);
                                  local_280._8_4_ = local_280._8_4_ + 1;
                                } while (local_280._8_4_ != local_248);
                              } while ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_280._0_8_
                                       != local_250);
                            }
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_280);
                            std::__cxx11::stringbuf::str();
                            iVar7 = std::__cxx11::string::compare(local_280);
                            TestEq<bool,bool>(true,iVar7 == 0,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                              ,0x3ea,
                                              "void (anonymous namespace)::test_vector_bug_1() [atomic_ref_counting = false, N = 6]"
                                             );
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)local_280._0_8_ !=
                                &_Stack_270) {
                              operator_delete((void *)local_280._0_8_,(long)_Stack_270 + 1);
                            }
                            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                            std::ios_base::~ios_base(local_178);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_228);
                            if (local_2b8 != (undefined1  [8])&local_2a8) {
                              operator_delete((void *)local_2b8,(ulong)((long)local_2a8 + 1));
                            }
                            immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::transient_rrb<char,_false,_6>_> *)&local_200)
                            ;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_218);
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int> *)local_2d8._0_8_ !=
                                &_Stack_2c8) {
                              operator_delete((void *)local_2d8._0_8_,(ulong)((long)_Stack_2c8 + 1))
                              ;
                            }
                            immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::transient_rrb<char,_false,_6>_> *)&local_258)
                            ;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_288);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            immutable::vector<char,_false,_6>::vector
                                      ((vector<char,_false,_6> *)local_2b8);
                            immutable::transient_vector<char,_false,_6>::transient_vector
                                      ((transient_vector<char,_false,_6> *)local_280,
                                       (ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                            local_2d8._0_4_ = (_Head_base<2UL,_unsigned_int,_false>)0x74;
                            local_2d8._4_4_ = 0;
                            local_1f8._0_8_ =
                                 (rrb<immutable::vector<char,_false,_6>,_true,_5> *)&_Stack_1e8;
                            __dest.ptr = (rrb<immutable::vector<char,_false,_6>,_true,_5> *)
                                         std::__cxx11::string::_M_create
                                                   ((ulong *)local_1f8,(ulong)local_2d8);
                            uVar1 = local_2d8._0_8_;
                            _Stack_1e8.super__Tuple_impl<2UL,_unsigned_int>.
                            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                                 (_Head_base<2UL,_unsigned_int,_false>)
                                 (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                            _Stack_1e8.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                 local_2d8._4_4_;
                            local_1f8._0_8_ = __dest.ptr;
                            memcpy(__dest.ptr,
                                   "sdflkjkljdsflkjasd;lkfjsadlkfja;sdlkfj;asdlkfjsld;kfjls;dakfjlwefjlwkedflskxnvnv;laskdjfl;kwejfrl;kjsad;lfkfj;lwkejf"
                                   ,0x74);
                            uVar4 = local_1f8._0_8_;
                            local_1f8._8_8_ = uVar1;
                            *(undefined1 *)
                             ((long)&(((_Tuple_impl<2UL,_unsigned_int> *)&(__dest.ptr)->cnt)->
                                     super__Head_base<2UL,_unsigned_int,_false>)._M_head_impl +
                             uVar1) = 0;
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)uVar1 !=
                                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              _Var17.super__Tuple_impl<2UL,_unsigned_int>.
                              super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                                   (_Head_base<2UL,_unsigned_int,_false>)0x0;
                              _Var17.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = 0;
                              do {
                                immutable::transient_rrb_push<char,false,6>
                                          ((immutable *)local_2d8,
                                           (ref<immutable::transient_rrb<char,_false,_6>_> *)
                                           local_280,*(char *)(uVar4 + (long)_Var17));
                                immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                          ((ref<immutable::transient_rrb<char,_false,_6>_> *)
                                           local_2d8);
                                _Var17 = (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)
                                         ((long)_Var17 + 1);
                              } while ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)uVar1 != _Var17
                                      );
                            }
                            immutable::vector<char,_false,_6>::vector
                                      ((vector<char,_false,_6> *)&local_250,
                                       (ref<immutable::transient_rrb<char,_false,_6>_> *)local_280);
                            local_2d8._0_8_ = local_2b8;
                            if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_2b8._0_4_ =
                                 local_250.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_2b8._4_4_ =
                                 local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            local_2d8._0_8_ = local_2b8;
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            bVar6 = immutable::validate_rrb<char,false,6>
                                              ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            TestEq<bool,bool>(true,bVar6,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                              ,0x3fa,
                                              "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                             );
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::vector<char,_false,_6>::insert
                                      ((vector<char,_false,_6> *)&local_250,
                                       (size_type_conflict)local_2b8,'\0');
                            local_2d8._0_8_ = local_2b8;
                            if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_2b8._0_4_ =
                                 local_250.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_2b8._4_4_ =
                                 local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            immutable::vector<char,_false,_6>::insert
                                      ((vector<char,_false,_6> *)&local_250,
                                       (size_type_conflict)local_2b8,'\0');
                            local_2d8._0_8_ = local_2b8;
                            if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_2b8._0_4_ =
                                 local_250.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_2b8._4_4_ =
                                 local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            immutable::vector<char,_false,_6>::insert
                                      ((vector<char,_false,_6> *)&local_250,
                                       (size_type_conflict)local_2b8,'\0');
                            local_2d8._0_8_ = local_2b8;
                            if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_2b8._0_4_ =
                                 local_250.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_2b8._4_4_ =
                                 local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            immutable::vector<char,_false,_6>::insert
                                      ((vector<char,_false,_6> *)&local_250,
                                       (size_type_conflict)local_2b8,'\0');
                            local_2d8._0_8_ = local_2b8;
                            if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_2b8._0_4_ =
                                 local_250.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_2b8._4_4_ =
                                 local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            immutable::vector<char,_false,_6>::insert
                                      ((vector<char,_false,_6> *)&local_250,
                                       (size_type_conflict)local_2b8,'\0');
                            local_2d8._0_8_ = local_2b8;
                            if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            local_2b8._0_4_ =
                                 local_250.super__Tuple_impl<2UL,_unsigned_int>.
                                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
                            local_2b8._4_4_ =
                                 local_250.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            local_2d8._0_8_ = local_2b8;
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            bVar6 = immutable::validate_rrb<char,false,6>
                                              ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            TestEq<bool,bool>(true,bVar6,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                              ,0x402,
                                              "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                             );
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            immutable::vector<char,_false,_6>::take
                                      ((vector<char,_false,_6> *)local_2d8,
                                       (size_type_conflict)local_2b8);
                            immutable::vector<char,_false,_6>::drop
                                      ((vector<char,_false,_6> *)&local_250,
                                       (size_type_conflict)local_2b8);
                            local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                                 (_Head_base<2UL,_unsigned_int,_false>)
                                 (_Head_base<2UL,_unsigned_int,_false>)local_2b8._0_4_;
                            local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                 local_2b8._4_4_;
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2b8 !=
                                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_2b8 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            bVar6 = immutable::validate_rrb<char,false,6>
                                              ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            TestEq<bool,bool>(true,bVar6,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                              ,0x407,
                                              "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                             );
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            local_2e0.super__Tuple_impl<2UL,_unsigned_int>.
                            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                                 (_Head_base<2UL,_unsigned_int,_false>)
                                 (_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_;
                            local_2e0.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                 local_2d8._4_4_;
                            if ((_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)local_2d8._0_8_ !=
                                (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)(local_2d8._0_8_ + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            bVar6 = immutable::validate_rrb<char,false,6>
                                              ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            TestEq<bool,bool>(true,bVar6,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                              ,0x408,
                                              "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                             );
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            local_2e0 = local_250;
                            if (local_250 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_250 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            bVar6 = immutable::validate_rrb<char,false,6>
                                              ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            TestEq<bool,bool>(true,bVar6,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                              ,0x409,
                                              "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                             );
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            immutable::operator+
                                      ((immutable *)&local_2e0,(vector<char,_false,_6> *)local_2d8,
                                       (vector<char,_false,_6> *)&local_250);
                            local_288 = local_2e0;
                            if (local_2e0 != (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)0x0) {
                              (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                              super___atomic_base<unsigned_int>)._M_i =
                                   (((atomic<unsigned_int> *)((long)local_2e0 + 0x20))->
                                   super___atomic_base<unsigned_int>)._M_i + 1;
                            }
                            bVar6 = immutable::validate_rrb<char,false,6>
                                              ((ref<immutable::rrb<char,_false,_6>_> *)&local_288);
                            TestEq<bool,bool>(true,bVar6,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                                              ,0x40d,
                                              "void (anonymous namespace)::test_bug_concat() [atomic_ref_counting = false, N = 6]"
                                             );
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_288);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_2e0);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)&local_250);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2d8);
                            if ((rrb<immutable::vector<char,_false,_6>,_true,_5> *)local_1f8._0_8_
                                != (rrb<immutable::vector<char,_false,_6>,_true,_5> *)&_Stack_1e8) {
                              operator_delete((void *)local_1f8._0_8_,(ulong)((long)_Stack_1e8 + 1))
                              ;
                            }
                            immutable::ref<immutable::transient_rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::transient_rrb<char,_false,_6>_> *)local_280);
                            immutable::ref<immutable::rrb<char,_false,_6>_>::~ref
                                      ((ref<immutable::rrb<char,_false,_6>_> *)local_2b8);
                            return;
                          }
                        }
                      }
                      __function = 
                      "T *immutable::ref<immutable::rrb<char, false, 6>>::operator->() const [T = immutable::rrb<char, false, 6>]"
                      ;
                      goto LAB_0012b80b;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012b7f6:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0012b80b:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

void run_tests()
    {        
    test_empty_vector<atomic_ref_counting, N>();
    test_push_back_simple<atomic_ref_counting, N>();
    test_push_back<atomic_ref_counting, N>();
    test_front<atomic_ref_counting, N>();
    test_back<atomic_ref_counting, N>();
    test_size<atomic_ref_counting, N>();
    test_pop_back<atomic_ref_counting, N>();
    test_update<atomic_ref_counting, N>();
    test_erase_single<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>(200, 50);
    test_insert_single<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>(200);
    test_drop<atomic_ref_counting, N>();
    test_take<atomic_ref_counting, N>();
    test_iterator<atomic_ref_counting, N>();
    test_iterator_2<atomic_ref_counting, N>();
    test_iterator_3<atomic_ref_counting, N>();
    test_reverse_iterator<atomic_ref_counting, N>();
    test_vector_equality<atomic_ref_counting, N>();
    test_insert_vector<atomic_ref_counting, N>();
    test_transient_vector_push<atomic_ref_counting, N>();
    test_transient_vector_pop<atomic_ref_counting, N>();
    test_transient_vector_update<atomic_ref_counting, N>();
    test_transient_vector_push_2<atomic_ref_counting, N>();
    test_transient_iterator<atomic_ref_counting, N>();
    test_transient_iterator_2<atomic_ref_counting, N>();
    test_transient_iterator_3<atomic_ref_counting, N>();
    test_transient_reverse_iterator<atomic_ref_counting, N>();
    test_catslice<atomic_ref_counting, N>();
    test_fibocat<atomic_ref_counting, N>();
    test_invalid_states<atomic_ref_counting, N>();
    test_erase<atomic_ref_counting, N>();
    test_concat<atomic_ref_counting, N>();    
    test_vector_of_vector<atomic_ref_counting, N>();
    test_vector_bug_1<atomic_ref_counting, N>();
    test_bug_concat<atomic_ref_counting, N>();
    }